

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlCreateObjectWithTag(JL_DATA_TYPE Type,size_t Tag,JlDataObject **pNewObject)

{
  JL_STATUS JVar1;
  JlDataObject *pJVar2;
  
  if (pNewObject != (JlDataObject **)0x0) {
    *pNewObject = (JlDataObject *)0x0;
    if (Type - JL_DATA_TYPE_STRING < 5) {
      pJVar2 = (JlDataObject *)WjTestLib_Calloc(0x28,1);
      if (pJVar2 == (JlDataObject *)0x0) {
        JVar1 = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        pJVar2->Type = Type;
        pJVar2->Tag = Tag;
        *pNewObject = pJVar2;
        JVar1 = JL_STATUS_SUCCESS;
      }
    }
    else {
      JVar1 = JL_STATUS_INVALID_TYPE;
    }
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlCreateObjectWithTag
    (
        JL_DATA_TYPE    Type,
        size_t          Tag,
        JlDataObject**  pNewObject
    )
{
    JL_STATUS jlStatus;
    JlDataObject* object = NULL;

    if( NULL != pNewObject )
    {
        *pNewObject = NULL;

        if( IsDataTypeValid( Type ) )
        {
            object = JlNew( JlDataObject );
            if( NULL != object )
            {
                object->Type = Type;
                object->Tag = Tag;
                *pNewObject = object;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            jlStatus = JL_STATUS_INVALID_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}